

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_functs.hpp
# Opt level: O1

void Limonp::loadStr2File(char *filename,openmode mode,string *str)

{
  long *plVar1;
  ofstream out;
  long local_208;
  filebuf local_200 [224];
  long alStack_120 [2];
  ios_base local_110 [264];
  
  std::ofstream::ofstream(&local_208,filename,mode);
  if ((0 < (long)str->_M_string_length) &&
     (plVar1 = *(long **)((long)alStack_120 + *(long *)(local_208 + -0x18)), plVar1 != (long *)0x0))
  {
    (**(code **)(*plVar1 + 0x60))(plVar1,(str->_M_dataplus)._M_p);
  }
  std::ofstream::close();
  local_208 = _VTT;
  *(undefined8 *)(local_200 + *(long *)(_VTT + -0x18) + -8) = _log;
  std::filebuf::~filebuf(local_200);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

inline void loadStr2File(const char * const filename, ios_base::openmode mode, const string& str)
    {
        ofstream out(filename, mode);
        ostreambuf_iterator<char> itr (out);
        copy(str.begin(), str.end(), itr);
        out.close();
    }